

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fftplt(fitsfile **fptr,char *filename,char *tempname,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined8 *in_RDI;
  int *in_stack_00000048;
  char *in_stack_00000050;
  fitsfile *in_stack_00000058;
  int *in_stack_00000888;
  char *in_stack_00000890;
  fitsfile **in_stack_00000898;
  undefined4 local_4;
  
  *in_RDI = 0;
  if (*in_RCX < 1) {
    iVar1 = ffinit(in_stack_00000898,in_stack_00000890,in_stack_00000888);
    if (iVar1 == 0) {
      ffoptplt(in_stack_00000058,in_stack_00000050,in_stack_00000048);
      local_4 = *in_RCX;
    }
    else {
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int fftplt(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *filename, /* I - name of file to create              */
           const char *tempname, /* I - name of template file               */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file  based on a template file.
  Uses C fopen and fgets functions.
*/
{
    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if ( ffinit(fptr, filename, status) )  /* create empty file */
        return(*status);

    ffoptplt(*fptr, tempname, status);  /* open and use template */

    return(*status);
}